

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

Property * __thiscall Rml::Property::operator=(Property *this,Property *param_1)

{
  int iVar1;
  Property *param_1_local;
  Property *this_local;
  
  Variant::operator=(&this->value,&param_1->value);
  iVar1 = param_1->specificity;
  this->unit = param_1->unit;
  this->specificity = iVar1;
  this->definition = param_1->definition;
  this->parser_index = param_1->parser_index;
  ::std::shared_ptr<const_Rml::PropertySource>::operator=(&this->source,&param_1->source);
  return this;
}

Assistant:

class RMLUICORE_API Property {
public:
	Property();
	template <typename PropertyType>
	Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}
	template <typename EnumType, typename = typename std::enable_if_t<std::is_enum<EnumType>::value, EnumType>>
	Property(EnumType value) : value(static_cast<int>(value)), unit(Unit::KEYWORD), specificity(-1)
	{}

	/// Get the value of the property as a string.
	String ToString() const;

	/// Get the value of the property as a numeric value, if applicable.
	NumericValue GetNumericValue() const;

	/// Templatised accessor.
	template <typename T>
	T Get() const
	{
		return value.Get<T>();
	}

	bool operator==(const Property& other) const { return unit == other.unit && value == other.value; }
	bool operator!=(const Property& other) const { return !(*this == other); }

	Variant value;
	Unit unit;
	int specificity;

	const PropertyDefinition* definition = nullptr;
	int parser_index = -1;

	SharedPtr<const PropertySource> source;
}